

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptor::FindEnumValueByName(FileDescriptor *this,string_view name)

{
  EnumValueDescriptor *pEVar1;
  Symbol local_28;
  FileDescriptor *local_20;
  FileDescriptor *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (FileDescriptor *)name._M_len;
  local_20 = this;
  local_28.ptr_ =
       (SymbolBase *)
       FileDescriptorTables::
       FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                 (this->tables_,this,name);
  pEVar1 = Symbol::enum_value_descriptor(&local_28);
  return pEVar1;
}

Assistant:

const EnumValueDescriptor* FileDescriptor::FindEnumValueByName(
    absl::string_view name) const {
  return tables_->FindNestedSymbol(this, name).enum_value_descriptor();
}